

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O3

void __thiscall UnitTest::UnitTester::runTestInt(UnitTester *this,TestFunction fun,char *name)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  size_t sVar4;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if ((_DAT_00106190 == (char *)0x0) || (iVar3 = strcmp(name,_DAT_00106190), iVar3 == 0)) {
    _global_unit_test_object_ = 1;
    _DAT_00106184 = 0x3f800000;
    _DAT_00106188 = 0x3ff0000000000000;
    (*fun)();
    if (DAT_00106179 == '\x01') {
      if (global_unit_test_object_ == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"XFAIL: ",7);
        if (name == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
        }
        else {
          sVar4 = strlen(name);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar4);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"unexpected PASS: ",0x11);
      if (name == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
      }
      else {
        sVar4 = strlen(name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "\n    This test should have failed but didn\'t. Check the code!",0x3d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
    }
    else {
      if (global_unit_test_object_ != '\0') {
        operator<<((ostream *)&std::cout,(Type *)"\x1b[1;40;32m");
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," PASS: ",7);
        operator<<((ostream *)&std::cout,(Type *)"\x1b[0m");
        if (name == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
        }
        else {
          sVar4 = strlen(name);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar4);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        this->passedTests = this->passedTests + 1;
        return;
      }
      if (_unittest_fail()::str == (char *)0x0) {
        bVar2 = mayUseColor((ostream *)&std::cout);
        _unittest_fail()::str = " FAIL: ";
        if (bVar2) {
          _unittest_fail()::str = " \x1b[1;40;31mFAIL:\x1b[0m ";
        }
      }
      pcVar1 = _unittest_fail()::str;
      sVar4 = strlen(_unittest_fail()::str);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar4);
      if (this->vim_lines == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_3cd3,4);
      }
      if (name == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
      }
      else {
        sVar4 = strlen(name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      if (this->vim_lines == true) {
        uStack_28 = CONCAT17(10,(undefined7)uStack_28);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)((long)&uStack_28 + 7),1);
      }
    }
    this->failedTests = this->failedTests + 1;
  }
  return;
}

Assistant:

void UnitTester::runTestInt(TestFunction fun, const char *name) {  // {{{1
  if (global_unit_test_object_.only_name &&
      0 != std::strcmp(name, global_unit_test_object_.only_name)) {
    return;
  }
  global_unit_test_object_.status = true;
  global_unit_test_object_.expect_failure = false;
  try {
    setFuzzyness<float>(1);
    setFuzzyness<double>(1);
    fun();
  }
  catch (UnitTestFailure) {
  }
  catch (std::exception &e) {
    std::cout << _unittest_fail() << "┍ " << name
              << " threw an unexpected exception:\n";
    std::cout << _unittest_fail() << "│ " << e.what() << '\n';
    global_unit_test_object_.status = false;
  }
  catch (...) {
    std::cout << _unittest_fail() << "┍ " << name
              << " threw an unexpected exception, of unknown type\n";
    global_unit_test_object_.status = false;
  }
  if (global_unit_test_object_.expect_failure) {
    if (!global_unit_test_object_.status) {
      std::cout << "XFAIL: " << name << std::endl;
    } else {
      std::cout
          << "unexpected PASS: " << name
          << "\n    This test should have failed but didn't. Check the code!"
          << std::endl;
      ++failedTests;
    }
  } else {
    if (!global_unit_test_object_.status) {
      std::cout << _unittest_fail();
      if (!vim_lines) {
        std::cout << "┕ ";
      }
      std::cout << name << std::endl;
      if (vim_lines) {
        std::cout << '\n';
      }
      ++failedTests;
    } else {
      UnitTest::printPass();
      std::cout << name;
      std::cout << std::endl;
      ++passedTests;
    }
  }
}